

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O3

void __thiscall
Future<void>::Private::ThreadPool::run(ThreadPool *this,_func_void_void_ptr *proc,void *args)

{
  usize *puVar1;
  usize uVar2;
  Item *pIVar3;
  Item *pIVar4;
  Item *pIVar5;
  ThreadContext *this_00;
  ulong uVar6;
  Node *pNVar7;
  Item *pIVar9;
  ulong uVar10;
  void *__stat_loc;
  ulong uVar11;
  Item *pIVar12;
  long lVar13;
  bool bVar14;
  Job job;
  undefined8 *puVar8;
  
  do {
    uVar10 = (this->_queue)._tail;
    while( true ) {
      uVar6 = uVar10;
      pNVar7 = (this->_queue)._queue;
      uVar10 = (this->_queue)._capacityMask & uVar6;
      __stat_loc = (void *)(uVar10 * 0x20);
      if (pNVar7[uVar10].tail != uVar6) break;
      puVar1 = &(this->_queue)._tail;
      LOCK();
      uVar10 = *puVar1;
      bVar14 = uVar6 == uVar10;
      if (bVar14) {
        *puVar1 = uVar6 + 1;
        uVar10 = uVar6;
      }
      UNLOCK();
      if (bVar14) goto LAB_001193ab;
    }
    LOCK();
    puVar1 = &(this->_dequeuedSignal)._state;
    uVar2 = *puVar1;
    *puVar1 = 0;
    UNLOCK();
    if (uVar2 == 1) {
      Signal::reset(&(this->_dequeuedSignal)._signal);
    }
    uVar10 = (this->_queue)._tail;
    while( true ) {
      uVar6 = uVar10;
      pNVar7 = (this->_queue)._queue;
      uVar10 = (this->_queue)._capacityMask & uVar6;
      __stat_loc = (void *)(uVar10 * 0x20);
      if (pNVar7[uVar10].tail != uVar6) break;
      puVar1 = &(this->_queue)._tail;
      LOCK();
      uVar10 = *puVar1;
      bVar14 = uVar6 == uVar10;
      if (bVar14) {
        *puVar1 = uVar6 + 1;
        uVar10 = uVar6;
      }
      UNLOCK();
      if (bVar14) goto LAB_001193ab;
    }
    if ((this->_dequeuedSignal)._state == 0) {
      Signal::wait(&(this->_dequeuedSignal)._signal,__stat_loc);
    }
  } while( true );
LAB_001193ab:
  puVar8 = (undefined8 *)((long)&(pNVar7->data).proc + (long)__stat_loc);
  *puVar8 = proc;
  puVar8[1] = args;
  LOCK();
  puVar8[3] = uVar6;
  UNLOCK();
  LOCK();
  puVar1 = &(this->_enqueuedSignal)._state;
  uVar2 = *puVar1;
  *puVar1 = 1;
  UNLOCK();
  if (uVar2 == 0) {
    Signal::set(&(this->_enqueuedSignal)._signal);
  }
  LOCK();
  puVar1 = &this->_pushedJobs;
  uVar10 = *puVar1;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  uVar6 = this->_threadCount;
  lVar13 = ~uVar10 + this->_processedJobs + uVar6;
  if (lVar13 == 1) {
    uVar10 = Time::ticks();
    this->_idleResetTime = (uint32)(uVar10 >> 10);
  }
  else if (lVar13 < 1) {
    uVar10 = Time::ticks();
    this->_idleResetTime = (uint32)(uVar10 >> 10);
    if (uVar6 < this->_maxThreads) {
      Mutex::lock(&this->_mutex);
      pIVar3 = (this->_threads)._end.item;
      for (pIVar12 = (this->_threads)._begin.item; pIVar12 != pIVar3; pIVar12 = pIVar12->next) {
        if (*(char *)&pIVar12[3].prev == '\x01') {
          pIVar4 = pIVar12->prev;
          pIVar5 = pIVar12->next;
          pIVar9 = pIVar4;
          if (pIVar4 == (Item *)0x0) {
            pIVar9 = (Item *)&this->_threads;
          }
          ((Iterator *)&pIVar9->next)->item = pIVar5;
          pIVar5->prev = pIVar4;
          puVar1 = &(this->_threads)._size;
          *puVar1 = *puVar1 - 1;
          Thread::~Thread((Thread *)(pIVar12 + 1));
          pIVar12->prev = (this->_threads).freeItem;
          (this->_threads).freeItem = pIVar12;
        }
      }
      if (this->_threadCount < this->_maxThreads) {
        this->_threadCount = this->_threadCount + 1;
        this_00 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::append
                            (&this->_threads);
      }
      else {
        this_00 = (ThreadContext *)0x0;
      }
      Mutex::unlock(&this->_mutex);
      if (this_00 != (ThreadContext *)0x0) {
        this_00->_pool = this;
        (this_00->_thread).func.c = &this_00->_thread;
        (this_00->_thread).func.a = (offset_in_Thread_to_subr)ThreadContext::proc;
        *(undefined8 *)&(this_00->_thread).func.field_0x10 = 0;
        bVar14 = Thread::start(&this_00->_thread,
                               Thread::
                               proc<Call<unsigned_int>::Member<Future<void>::Private::ThreadPool::ThreadContext>::Func0>
                               ,&(this_00->_thread).func);
        if (!bVar14) {
          this_00->_terminated = true;
        }
      }
    }
  }
  else if ((this->_minThreads < uVar6) &&
          (uVar10 = Time::ticks(), 1 < (int)(uVar10 >> 10) - this->_idleResetTime)) {
    Mutex::lock(&this->_mutex);
    if (this->_minThreads < this->_threadCount) {
      uVar10 = (this->_queue)._tail;
      do {
        uVar6 = uVar10;
        pNVar7 = (this->_queue)._queue;
        uVar11 = (this->_queue)._capacityMask & uVar6;
        if (pNVar7[uVar11].tail != uVar6) goto LAB_001194a0;
        puVar1 = &(this->_queue)._tail;
        LOCK();
        uVar10 = *puVar1;
        bVar14 = uVar6 == uVar10;
        if (bVar14) {
          *puVar1 = uVar6 + 1;
          uVar10 = uVar6;
        }
        UNLOCK();
      } while (!bVar14);
      pNVar7 = pNVar7 + uVar11;
      (pNVar7->data).proc = (_func_void_void_ptr *)0x0;
      (pNVar7->data).args = (void *)0x0;
      LOCK();
      pNVar7->head = uVar6;
      UNLOCK();
      this->_threadCount = this->_threadCount - 1;
    }
LAB_001194a0:
    pIVar3 = (this->_threads)._end.item;
    pIVar12 = (this->_threads)._begin.item;
    if (pIVar12 != pIVar3) {
      do {
        if (*(char *)&pIVar12[3].prev == '\x01') {
          pIVar4 = pIVar12->prev;
          pIVar5 = pIVar12->next;
          pIVar9 = pIVar4;
          if (pIVar4 == (Item *)0x0) {
            pIVar9 = (Item *)&this->_threads;
          }
          pIVar9->next = pIVar5;
          pIVar5->prev = pIVar4;
          puVar1 = &(this->_threads)._size;
          *puVar1 = *puVar1 - 1;
          Thread::~Thread((Thread *)(pIVar12 + 1));
          pIVar12->prev = (this->_threads).freeItem;
          (this->_threads).freeItem = pIVar12;
        }
        pIVar12 = pIVar12->next;
      } while (pIVar12 != pIVar3);
    }
    Mutex::unlock(&this->_mutex);
  }
  return;
}

Assistant:

void run(void (*proc)(void *), void *args)
    {
      Job job = {proc, args};
      while (!_queue.push(job))
      {
        _dequeuedSignal.reset();
        if (_queue.push(job))
          break;
        _dequeuedSignal.wait();
      }
      _enqueuedSignal.set();

      // adjust worker thread count
      usize pushedJobs = Atomic::increment(_pushedJobs);
      ssize busyThreads = (ssize)(pushedJobs - _processedJobs);
      usize threadCount = _threadCount;
      ssize idleThreads = (ssize)threadCount - busyThreads;
      if (idleThreads == 1)
        _idleResetTime = (uint32)(Time::ticks() >> 10);
      else
      {
        if (idleThreads <= 0)
        { // start new worker thread
          _idleResetTime = (uint32)(Time::ticks() >> 10);
          if (threadCount < _maxThreads)
          {
            ThreadContext *context = 0;
            {
              Mutex::Guard guard(_mutex);
              for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end;)
              {
                if (i->_terminated)
                  i = _threads.remove(i);
                else
                  ++i;
              }
              if (_threadCount < _maxThreads)
              {
                ++_threadCount;
                context = &_threads.append();
              }
            }
            if (context)
            {
              context->_pool = this;
              if (!context->_thread.start(*context, &ThreadContext::proc))
                context->_terminated = true;
            }
          }
        }
        else if (idleThreads > 1 && threadCount > _minThreads && (uint32)(Time::ticks() >> 10) - _idleResetTime > 1)
        { // terminate a worker thread
          Mutex::Guard guard(_mutex);
          if (_threadCount > _minThreads)
          {
            Job job = {0, 0};
            if (_queue.push(job))
              --_threadCount;
          }
          for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end;)
          {
            if (i->_terminated)
              i = _threads.remove(i);
            else
              ++i;
          }
        }
      }
    }